

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  bool bVar1;
  TablePrinter *this_00;
  ColourImpl *pCVar2;
  ColourGuard *rhs;
  size_type sVar3;
  ostream *poVar4;
  code *pcVar5;
  string local_70;
  double local_50;
  double dur;
  ColourGuard local_38;
  undefined1 local_28 [8];
  ColourGuard guard;
  SectionStats *_sectionStats_local;
  ConsoleReporter *this_local;
  
  guard._8_8_ = _sectionStats;
  this_00 = Detail::unique_ptr<Catch::TablePrinter>::operator->(&this->m_tablePrinter);
  TablePrinter::close(this_00,(int)_sectionStats);
  if ((*(byte *)(guard._8_8_ + 0x58) & 1) != 0) {
    lazyPrint(this);
    pCVar2 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                       (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    ColourImpl::guardColour((ColourImpl *)&local_38,(Code)pCVar2);
    rhs = ColourImpl::ColourGuard::engage
                    (&local_38,(this->super_StreamingReporterBase).super_ReporterBase.m_stream);
    ColourImpl::ColourGuard::ColourGuard((ColourGuard *)local_28,rhs);
    ColourImpl::ColourGuard::~ColourGuard(&local_38);
    sVar3 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                      (&(this->super_StreamingReporterBase).m_sectionStack);
    if (sVar3 < 2) {
      std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                      "\nNo assertions in test case");
    }
    else {
      std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                      "\nNo assertions in section");
    }
    poVar4 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream," \'");
    poVar4 = std::operator<<(poVar4,(string *)guard._8_8_);
    poVar4 = std::operator<<(poVar4,"\'\n\n");
    pcVar5 = std::flush<char,std::char_traits<char>>;
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_28);
    _sectionStats = (SectionStats *)pcVar5;
  }
  local_50 = *(double *)(guard._8_8_ + 0x50);
  bVar1 = shouldShowDuration((this->super_StreamingReporterBase).super_ReporterBase.
                             super_IEventListener.m_config,local_50);
  if (bVar1) {
    poVar4 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    getFormattedDuration_abi_cxx11_(&local_70,(Catch *)_sectionStats,local_50);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    poVar4 = std::operator<<(poVar4," s: ");
    poVar4 = std::operator<<(poVar4,(string *)guard._8_8_);
    poVar4 = std::operator<<(poVar4,'\n');
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((this->m_headerPrinted & 1U) != 0) {
    this->m_headerPrinted = false;
  }
  StreamingReporterBase::sectionEnded
            (&this->super_StreamingReporterBase,(SectionStats *)guard._8_8_);
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        auto guard =
            m_colour->guardColour( Colour::ResultError ).engage( m_stream );
        if (m_sectionStack.size() > 1)
            m_stream << "\nNo assertions in section";
        else
            m_stream << "\nNo assertions in test case";
        m_stream << " '" << _sectionStats.sectionInfo.name << "'\n\n" << std::flush;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        m_stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << '\n' << std::flush;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}